

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ArenaReleaseOneofMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_ArenaReleaseOneofMessageTest_Test *this)

{
  Message *pMVar1;
  FieldDescriptor *pFVar2;
  Message *pMVar3;
  pointer *__ptr_1;
  char *in_R9;
  pointer *__ptr;
  string_view name;
  string_view name_00;
  Metadata MVar4;
  Metadata MVar5;
  AssertionResult gtest_ar_;
  Arena arena;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  AssertHelper local_108;
  internal local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  string local_f0;
  ThreadSafeArena local_d0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_d0);
  pMVar1 = (Message *)Arena::DefaultConstruct<proto2_unittest::TestOneof2>((Arena *)&local_d0);
  TestUtil::ReflectionTester::SetOneofViaReflection(pMVar1);
  MVar4 = proto2_unittest::TestOneof2::GetMetadata
                    ((TestOneof2 *)proto2_unittest::_TestOneof2_default_instance_);
  MVar5 = proto2_unittest::TestOneof2::GetMetadata
                    ((TestOneof2 *)proto2_unittest::_TestOneof2_default_instance_);
  name._M_str = "foo_lazy_message";
  name._M_len = 0x10;
  pFVar2 = Descriptor::FindFieldByName(MVar4.descriptor,name);
  pMVar3 = Reflection::ReleaseMessage(MVar5.reflection,pMVar1,pFVar2,(MessageFactory *)0x0);
  local_100[0] = (internal)(pMVar3 != (Message *)0x0);
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_100[0]) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,local_100,(AssertionResult *)"released != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x586,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,local_f8);
  }
  if (pMVar3 != (Message *)0x0) {
    (*(pMVar3->super_MessageLite)._vptr_MessageLite[1])(pMVar3);
  }
  name_00._M_str = "foo_lazy_message";
  name_00._M_len = 0x10;
  pFVar2 = Descriptor::FindFieldByName(MVar4.descriptor,name_00);
  pMVar1 = Reflection::ReleaseMessage(MVar5.reflection,pMVar1,pFVar2,(MessageFactory *)0x0);
  local_100[0] = (internal)(pMVar1 == (Message *)0x0);
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_100[0]) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,local_100,(AssertionResult *)"released == nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x58b,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,local_f8);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_d0);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ArenaReleaseOneofMessageTest) {
  Arena arena;
  unittest::TestOneof2* message = Arena::Create<unittest::TestOneof2>(&arena);
  TestUtil::ReflectionTester::SetOneofViaReflection(message);

  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = message->GetReflection();
  Message* released = reflection->ReleaseMessage(
      message, descriptor->FindFieldByName("foo_lazy_message"));

  EXPECT_TRUE(released != nullptr);
  delete released;

  released = reflection->ReleaseMessage(
      message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_TRUE(released == nullptr);
}